

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void gen_bitlen(deflate_state *s,tree_desc *desc)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ct_data *pcVar6;
  ct_data *pcVar7;
  intf *piVar8;
  uint uVar9;
  int local_5c;
  int overflow;
  uint uStack_50;
  ush f;
  int xbits;
  int bits;
  int m;
  int n;
  int h;
  int max_length;
  int base;
  intf *extra;
  ct_data *stree;
  int max_code;
  ct_data *tree;
  tree_desc *desc_local;
  deflate_state *s_local;
  
  pcVar6 = desc->dyn_tree;
  iVar2 = desc->max_code;
  pcVar7 = desc->stat_desc->static_tree;
  piVar8 = desc->stat_desc->extra_bits;
  iVar3 = desc->stat_desc->extra_base;
  uVar4 = desc->stat_desc->max_length;
  local_5c = 0;
  for (uStack_50 = 0; (int)uStack_50 < 0x10; uStack_50 = uStack_50 + 1) {
    s->bl_count[(int)uStack_50] = 0;
  }
  pcVar6[s->heap[s->heap_max]].dl.dad = 0;
  m = s->heap_max;
  while (m = m + 1, m < 0x23d) {
    iVar5 = s->heap[m];
    uStack_50 = pcVar6[pcVar6[iVar5].dl.dad].dl.dad + 1;
    if ((int)uVar4 < (int)uStack_50) {
      local_5c = local_5c + 1;
      uStack_50 = uVar4;
    }
    pcVar6[iVar5].dl.dad = (ush)uStack_50;
    if (iVar5 <= iVar2) {
      s->bl_count[(int)uStack_50] = s->bl_count[(int)uStack_50] + 1;
      overflow = 0;
      if (iVar3 <= iVar5) {
        overflow = piVar8[iVar5 - iVar3];
      }
      uVar1 = pcVar6[iVar5].fc.freq;
      s->opt_len = (ulong)uVar1 * (ulong)(uStack_50 + overflow) + s->opt_len;
      if (pcVar7 != (ct_data *)0x0) {
        s->static_len =
             (ulong)uVar1 * (ulong)((uint)pcVar7[iVar5].dl.dad + overflow) + s->static_len;
      }
    }
  }
  uStack_50 = uVar4;
  if (local_5c != 0) {
    do {
      do {
        uVar9 = uStack_50;
        uStack_50 = uVar9 - 1;
      } while (s->bl_count[(int)uStack_50] == 0);
      s->bl_count[(int)uStack_50] = s->bl_count[(int)uStack_50] - 1;
      s->bl_count[(int)uVar9] = s->bl_count[(int)uVar9] + 2;
      s->bl_count[(int)uVar4] = s->bl_count[(int)uVar4] - 1;
      local_5c = local_5c + -2;
      uStack_50 = uVar4;
    } while (0 < local_5c);
    for (; uStack_50 != 0; uStack_50 = uStack_50 - 1) {
      bits = (int)s->bl_count[(int)uStack_50];
      while (bits != 0) {
        m = m + -1;
        iVar3 = s->heap[m];
        if (iVar3 <= iVar2) {
          if (pcVar6[iVar3].dl.dad != uStack_50) {
            s->opt_len = ((long)(int)uStack_50 - (ulong)pcVar6[iVar3].dl.dad) *
                         (ulong)pcVar6[iVar3].fc.freq + s->opt_len;
            pcVar6[iVar3].dl.dad = (ush)uStack_50;
          }
          bits = bits + -1;
        }
      }
    }
  }
  return;
}

Assistant:

local void gen_bitlen(deflate_state *s, tree_desc *desc) {
    ct_data *tree        = desc->dyn_tree;
    int max_code         = desc->max_code;
    const ct_data *stree = desc->stat_desc->static_tree;
    const intf *extra    = desc->stat_desc->extra_bits;
    int base             = desc->stat_desc->extra_base;
    int max_length       = desc->stat_desc->max_length;
    int h;              /* heap index */
    int n, m;           /* iterate over the tree elements */
    int bits;           /* bit length */
    int xbits;          /* extra bits */
    ush f;              /* frequency */
    int overflow = 0;   /* number of elements with bit length too large */

    for (bits = 0; bits <= MAX_BITS; bits++) s->bl_count[bits] = 0;

    /* In a first pass, compute the optimal bit lengths (which may
     * overflow in the case of the bit length tree).
     */
    tree[s->heap[s->heap_max]].Len = 0; /* root of the heap */

    for (h = s->heap_max + 1; h < HEAP_SIZE; h++) {
        n = s->heap[h];
        bits = tree[tree[n].Dad].Len + 1;
        if (bits > max_length) bits = max_length, overflow++;
        tree[n].Len = (ush)bits;
        /* We overwrite tree[n].Dad which is no longer needed */

        if (n > max_code) continue; /* not a leaf node */

        s->bl_count[bits]++;
        xbits = 0;
        if (n >= base) xbits = extra[n - base];
        f = tree[n].Freq;
        s->opt_len += (ulg)f * (unsigned)(bits + xbits);
        if (stree) s->static_len += (ulg)f * (unsigned)(stree[n].Len + xbits);
    }
    if (overflow == 0) return;

    Tracev((stderr,"\nbit length overflow\n"));
    /* This happens for example on obj2 and pic of the Calgary corpus */

    /* Find the first bit length which could increase: */
    do {
        bits = max_length - 1;
        while (s->bl_count[bits] == 0) bits--;
        s->bl_count[bits]--;        /* move one leaf down the tree */
        s->bl_count[bits + 1] += 2; /* move one overflow item as its brother */
        s->bl_count[max_length]--;
        /* The brother of the overflow item also moves one step up,
         * but this does not affect bl_count[max_length]
         */
        overflow -= 2;
    } while (overflow > 0);

    /* Now recompute all bit lengths, scanning in increasing frequency.
     * h is still equal to HEAP_SIZE. (It is simpler to reconstruct all
     * lengths instead of fixing only the wrong ones. This idea is taken
     * from 'ar' written by Haruhiko Okumura.)
     */
    for (bits = max_length; bits != 0; bits--) {
        n = s->bl_count[bits];
        while (n != 0) {
            m = s->heap[--h];
            if (m > max_code) continue;
            if ((unsigned) tree[m].Len != (unsigned) bits) {
                Tracev((stderr,"code %d bits %d->%d\n", m, tree[m].Len, bits));
                s->opt_len += ((ulg)bits - tree[m].Len) * tree[m].Freq;
                tree[m].Len = (ush)bits;
            }
            n--;
        }
    }
}